

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assume_tests.cpp
# Opt level: O0

void __thiscall
iu_AssumeTest_x_iutest_x_THROW_VALUE_NE_Test::Body
          (iu_AssumeTest_x_iutest_x_THROW_VALUE_NE_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult ar_1;
  int *e_1;
  AssertionResult iutest_ar_1;
  Fixed local_210;
  AssertionResult ar;
  int *e;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_AssumeTest_x_iutest_x_THROW_VALUE_NE_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  iutest::AssertionSuccess();
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (bVar1) {
    iutest::detail::AlwaysTrue();
    iutest::AssertionResult::operator<<
              ((AssertionResult *)local_38,
               (char (*) [81])
               "\nExpected: (void)0 throws an exception of type int.\n  Actual: it throws nothing.")
    ;
  }
  memset(&local_210,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_210);
  message = iutest::AssertionResult::message((AssertionResult *)local_38);
  iutest::AssertionHelper::AssertionHelper
            ((AssertionHelper *)&iutest_ar_1.m_result,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assume_tests.cpp"
             ,0x73,message,kAssumeFailure);
  iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_210);
  iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
  iutest::AssertionHelper::Fixed::~Fixed(&local_210);
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

IUTEST(AssumeTest, THROW_VALUE_NE)
{
    IUTEST_ASSUME_THROW_VALUE_NE((void)0, int, 0);
    IUTEST_ASSERT_THROW_VALUE_NE((void)0, int, 0);
}